

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::on_port_mapping
          (session_impl *this,port_mapping_t mapping,address *external_ip,int port,
          portmap_protocol proto,error_code *ec,portmap_transport transport,listen_socket_handle *ls
          )

{
  listen_socket_t *plVar1;
  listen_port_mapping *plVar2;
  bool bVar3;
  portmap_protocol local_51;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_50;
  int local_4c;
  address local_48;
  
  local_51 = proto;
  local_50.m_val = mapping.m_val;
  local_4c = port;
  plVar1 = listen_socket_handle::get(ls);
  if ((ec->failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 5) != 0)) {
    if (plVar1 == (listen_socket_t *)0x0) {
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
      local_48.type_ = ipv4;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    }
    else if ((plVar1->local_endpoint).impl_.data_.base.sa_family == 2) {
      local_48._0_8_ = (ulong)(plVar1->local_endpoint).impl_.data_.v6.sin6_flowinfo << 0x20;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
    }
    else {
      local_48.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 8);
      local_48.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 0x10);
      local_48.ipv6_address_.scope_id_ =
           (unsigned_long)(plVar1->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_48.type_ = ipv6;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_error_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,libtorrent::portmap_transport_const&,boost::system::error_code_const&,boost::asio::ip::address>
              (&this->m_alerts,&local_50,&transport,ec,&local_48);
  }
  if (plVar1 == (listen_socket_t *)0x0) {
    return;
  }
  if (ec->failed_ == false) {
    if (external_ip->type_ == ipv4) {
      bVar3 = (external_ip->ipv4_address_).addr_.s_addr == 0;
LAB_002d4bb6:
      if (bVar3) goto LAB_002d4bdd;
    }
    else if (((((((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == '\0') &&
                ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == '\0')) &&
               ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == '\0')) &&
              (((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == '\0' &&
               ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == '\0')))) &&
             ((((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == '\0' &&
               (((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == '\0' &&
                ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == '\0')))) &&
              ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == '\0')))) &&
            (((((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == '\0' &&
               ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == '\0')) &&
              ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] == '\0')) &&
             ((((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
               ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0')) &&
              ((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0')))))) {
      bVar3 = (external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\0';
      goto LAB_002d4bb6;
    }
    local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_48.ipv6_address_.scope_id_ = 0;
    local_48.type_ = ipv4;
    local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    ip_voter::cast_vote(&plVar1->external_address,external_ip,(ip_source_t)0x10,&local_48);
  }
LAB_002d4bdd:
  if (local_51 == udp) {
    if ((plVar1->udp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>._M_elems
        [transport].mapping.m_val != local_50.m_val) goto LAB_002d4c33;
    plVar2 = (plVar1->udp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems + transport;
  }
  else {
    if ((local_51 != tcp) ||
       ((plVar1->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>._M_elems
        [transport].mapping.m_val != local_50.m_val)) goto LAB_002d4c33;
    plVar2 = (plVar1->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems + transport;
  }
  plVar2->port = local_4c;
LAB_002d4c33:
  if ((ec->failed_ == false) && (((this->m_alerts).m_alert_mask._M_i.m_val & 4) != 0)) {
    if ((plVar1->local_endpoint).impl_.data_.base.sa_family == 2) {
      local_48._0_8_ = (ulong)(plVar1->local_endpoint).impl_.data_.v6.sin6_flowinfo << 0x20;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
    }
    else {
      local_48.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 8);
      local_48.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 0x10);
      local_48.ipv6_address_.scope_id_ =
           (unsigned_long)(plVar1->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_48.type_ = ipv6;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,int&,libtorrent::portmap_transport_const&,libtorrent::portmap_protocol_const&,boost::asio::ip::address>
              (&this->m_alerts,&local_50,&local_4c,&transport,&local_51,&local_48);
  }
  return;
}

Assistant:

void session_impl::on_port_mapping(port_mapping_t const mapping
		, address const& external_ip, int port
		, portmap_protocol const proto, error_code const& ec
		, portmap_transport const transport
		, listen_socket_handle const& ls)
	{
		TORRENT_ASSERT(is_single_thread());

		listen_socket_t* listen_socket = ls.get();

		// NOTE: don't assume that if ec != 0, the rest of the logic
		// is not necessary, the ports still need to be set, in other
		// words, don't early return without careful review of the
		// remaining logic
		if (ec && m_alerts.should_post<portmap_error_alert>())
		{
			m_alerts.emplace_alert<portmap_error_alert>(mapping
				, transport, ec, listen_socket ? listen_socket->local_endpoint.address() : address());
		}

		if (!listen_socket) return;

		if (!ec && !external_ip.is_unspecified())
		{
			// TODO: 1 report the proper address of the router as the source IP of
			// this vote of our external address, instead of the empty address
			listen_socket->external_address.cast_vote(external_ip, source_router, address());
		}

		// need to check whether this mapping is for one of session ports (it could also be a user mapping)
		if ((proto == portmap_protocol::tcp) && (listen_socket->tcp_port_mapping[transport].mapping == mapping))
			listen_socket->tcp_port_mapping[transport].port = port;
		else if ((proto == portmap_protocol::udp) && (listen_socket->udp_port_mapping[transport].mapping == mapping))
			listen_socket->udp_port_mapping[transport].port = port;

		if (!ec && m_alerts.should_post<portmap_alert>())
		{
			m_alerts.emplace_alert<portmap_alert>(mapping, port
				, transport, proto, listen_socket->local_endpoint.address());
		}
	}